

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int ARKStepSetNonlinearSolver(void *arkode_mem,SUNNonlinearSolver NLS)

{
  int iVar1;
  void *in_RSI;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  SUNNonlinearSolver in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SUNNonlinearSolver in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ARKodeMem *)in_stack_ffffffffffffffc8,(ARKodeARKStepMem *)0x117ced9);
  if (local_4 == 0) {
    if (in_RSI == (void *)0x0) {
      arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::ARKStep","ARKStepSetNonlinearSolver",
                      "The NLS input must be non-NULL");
      local_4 = -0x16;
    }
    else if (((**(long **)((long)in_RSI + 8) == 0) ||
             (*(long *)(*(long *)((long)in_RSI + 8) + 0x18) == 0)) ||
            (*(long *)(*(long *)((long)in_RSI + 8) + 0x28) == 0)) {
      arkProcessError(local_20,-0x16,"ARKode","ARKStepSetNonlinearSolver",
                      "NLS does not support required operations");
      local_4 = -0x16;
    }
    else {
      iVar1 = 0;
      if ((in_stack_ffffffffffffffd8[5].content != (void *)0x0) &&
         (*(int *)&in_stack_ffffffffffffffd8[5].ops != 0)) {
        iVar1 = SUNNonlinSolFree(in_stack_ffffffffffffffc8);
      }
      in_stack_ffffffffffffffd8[5].content = in_RSI;
      *(undefined4 *)&in_stack_ffffffffffffffd8[5].ops = 0;
      iVar1 = SUNNonlinSolSetConvTestFn
                        (in_stack_ffffffffffffffd8,
                         (SUNNonlinSolConvTestFn)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8);
      if (iVar1 == 0) {
        iVar1 = SUNNonlinSolSetMaxIters(in_stack_ffffffffffffffc8,0);
        if (iVar1 == 0) {
          if (in_stack_ffffffffffffffd8->ops == (SUNNonlinearSolver_Ops)0x0) {
            arkProcessError(local_20,-0x16,"ARKode::ARKStep","ARKStepSetNonlinearSolver",
                            "The implicit ODE RHS function is NULL");
            local_4 = -0x16;
          }
          else {
            in_stack_ffffffffffffffd8[5].sunctx = (SUNContext)in_stack_ffffffffffffffd8->ops;
            local_4 = 0;
          }
        }
        else {
          arkProcessError(local_20,-0x16,"ARKode::ARKStep","ARKStepSetNonlinearSolver",
                          "Setting maximum number of nonlinear iterations failed");
          local_4 = -0x16;
        }
      }
      else {
        arkProcessError(local_20,-0x16,"ARKode::ARKStep","ARKStepSetNonlinearSolver",
                        "Setting convergence test function failed");
        local_4 = -0x16;
      }
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetNonlinearSolver(void *arkode_mem, SUNNonlinearSolver NLS)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetNonlinearSolver",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Return immediately if NLS input is NULL */
  if (NLS == NULL) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetNonlinearSolver",
                    "The NLS input must be non-NULL");
    return(ARK_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if ( (NLS->ops->gettype    == NULL) ||
       (NLS->ops->solve      == NULL) ||
       (NLS->ops->setsysfn   == NULL) ) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "ARKStepSetNonlinearSolver",
                    "NLS does not support required operations");
    return(ARK_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
    retval = SUNNonlinSolFree(step_mem->NLS);

  /* set SUNNonlinearSolver pointer */
  step_mem->NLS = NLS;
  step_mem->ownNLS = SUNFALSE;

  /* set default convergence test function */
  retval = SUNNonlinSolSetConvTestFn(step_mem->NLS, arkStep_NlsConvTest,
                                     (void*) ark_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetNonlinearSolver",
                    "Setting convergence test function failed");
    return(ARK_ILL_INPUT);
  }

  /* set default nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(step_mem->NLS, step_mem->maxcor);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetNonlinearSolver",
                    "Setting maximum number of nonlinear iterations failed");
    return(ARK_ILL_INPUT);
  }

  /* set the nonlinear system RHS function */
  if (!(step_mem->fi)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetNonlinearSolver",
                    "The implicit ODE RHS function is NULL");
    return(ARK_ILL_INPUT);
  }
  step_mem->nls_fi = step_mem->fi;

  return(ARK_SUCCESS);
}